

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O0

void __thiscall GdlLanguageDefn::SetCode(GdlLanguageDefn *this,string *staCode)

{
  void *__src;
  size_t __n;
  string *in_RSI;
  long in_RDI;
  string local_30 [48];
  
  std::__cxx11::string::substr((ulong)local_30,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_30);
  std::__cxx11::string::~string(local_30);
  memset((void *)(in_RDI + 0x30),0,4);
  __src = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::size();
  memcpy((void *)(in_RDI + 0x30),__src,__n);
  return;
}

Assistant:

void SetCode(std::string staCode)
	{
		Assert(staCode.length() <= 4);
		staCode = staCode.substr(0, 4);
		memset(m_rgchID, 0, sizeof(m_rgchID));
		memcpy(m_rgchID, staCode.data(), staCode.size() * sizeof(char));
	}